

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::MultiThreadedObjectTest::destroyObjects(MultiThreadedObjectTest *this,TestThread *thread)

{
  EGLDisplay *t;
  long lVar1;
  long lVar2;
  long *plVar3;
  deUint32 dVar4;
  Library *pLVar5;
  ThreadLog *pTVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  EndMessageToken *pEVar10;
  int contextNdx;
  long lVar11;
  int pbufferNdx;
  long lVar12;
  ThreadLog *this_00;
  long lVar13;
  bool bVar14;
  
  pLVar5 = MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  bVar14 = thread->m_id == 0;
  lVar11 = 0x1b8;
  if (bVar14) {
    lVar11 = 0x1a0;
  }
  lVar7 = 0x170;
  if (bVar14) {
    lVar7 = 0x158;
  }
  lVar8 = 0x128;
  if (bVar14) {
    lVar8 = 0x110;
  }
  lVar9 = 0x200;
  if (bVar14) {
    lVar9 = 0x1e8;
  }
  t = &(this->super_MultiThreadedTest).m_display;
  this_00 = &thread->m_log;
  lVar13 = 0;
  lVar12 = 0;
  while( true ) {
    lVar1 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode._vptr_TestNode + lVar11);
    lVar2 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx + lVar11);
    if ((int)((ulong)(lVar2 - lVar1) >> 3) <= lVar12) break;
    if (*(long *)(lVar1 + lVar13) != 0) {
      (*pLVar5->_vptr_Library[0x16])(pLVar5,(this->super_MultiThreadedTest).m_display);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00," = eglDestroySurface(");
      pTVar6 = ThreadLog::operator<<(this_00,t);
      std::operator<<((ostream *)pTVar6,", ");
      pTVar6 = ThreadLog::operator<<
                         (pTVar6,(void **)(*(long *)((long)&(this->super_MultiThreadedTest).
                                                            super_TestCase.super_TestCase.
                                                            super_TestNode._vptr_TestNode + lVar11)
                                          + lVar13));
      pEVar10 = (EndMessageToken *)0x17263e7;
      std::operator<<((ostream *)pTVar6,")");
      ThreadLog::operator<<(pTVar6,pEVar10);
      dVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
      eglu::checkError(dVar4,"eglDestroySurface()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x5aa);
      *(undefined8 *)
       (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                         super_TestNode._vptr_TestNode + lVar11) + lVar13) = 0;
    }
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 8;
  }
  if (lVar2 != lVar1) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar11) = lVar1;
  }
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar7);
  lVar12 = 8;
  lVar13 = 0;
  while( true ) {
    lVar1 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx + lVar7);
    if ((int)((ulong)(lVar1 - lVar11) >> 4) <= lVar13) break;
    if (*(long *)(lVar11 + lVar12) != 0) {
      std::operator<<((ostream *)this_00,"eglDestroySurface(");
      pTVar6 = ThreadLog::operator<<(this_00,t);
      std::operator<<((ostream *)pTVar6,", ");
      pTVar6 = ThreadLog::operator<<
                         (pTVar6,(void **)(*(long *)((long)&(this->super_MultiThreadedTest).
                                                            super_TestCase.super_TestCase.
                                                            super_TestNode._vptr_TestNode + lVar7) +
                                          lVar12));
      pEVar10 = (EndMessageToken *)0x17263e7;
      std::operator<<((ostream *)pTVar6,")");
      ThreadLog::operator<<(pTVar6,pEVar10);
      (*pLVar5->_vptr_Library[0x16])
                (pLVar5,(this->super_MultiThreadedTest).m_display,
                 *(undefined8 *)
                  (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                    super_TestNode._vptr_TestNode + lVar7) + lVar12));
      dVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
      eglu::checkError(dVar4,"destroySurface(m_display, windows[windowNdx].second)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x5b5);
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar7);
      *(undefined8 *)(lVar11 + lVar12) = 0;
    }
    plVar3 = *(long **)(lVar11 + -8 + lVar12);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar7);
      *(undefined8 *)(lVar11 + -8 + lVar12) = 0;
    }
    lVar13 = lVar13 + 1;
    lVar12 = lVar12 + 0x10;
  }
  if (lVar1 != lVar11) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar7) = lVar11;
  }
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar8);
  lVar7 = 8;
  for (lVar12 = 0;
      lVar13 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar8),
      lVar12 < (int)((ulong)(lVar13 - lVar11) >> 4); lVar12 = lVar12 + 1) {
    if (*(long *)(lVar11 + -8 + lVar7) != 0) {
      std::operator<<((ostream *)this_00,"eglDestroySurface(");
      pTVar6 = ThreadLog::operator<<(this_00,t);
      std::operator<<((ostream *)pTVar6,", ");
      pTVar6 = ThreadLog::operator<<
                         (pTVar6,(void **)(*(long *)((long)&(this->super_MultiThreadedTest).
                                                            super_TestCase.super_TestCase.
                                                            super_TestNode._vptr_TestNode + lVar8) +
                                          lVar7));
      pEVar10 = (EndMessageToken *)0x17263e7;
      std::operator<<((ostream *)pTVar6,")");
      ThreadLog::operator<<(pTVar6,pEVar10);
      (*pLVar5->_vptr_Library[0x16])
                (pLVar5,(this->super_MultiThreadedTest).m_display,
                 *(undefined8 *)
                  (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                    super_TestNode._vptr_TestNode + lVar8) + lVar7));
      dVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
      eglu::checkError(dVar4,"destroySurface(m_display, pixmaps[pixmapNdx].second)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x5c6);
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar8);
      *(undefined8 *)(lVar11 + lVar7) = 0;
      plVar3 = *(long **)(lVar11 + -8 + lVar7);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
        lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                  super_TestNode._vptr_TestNode + lVar8);
        *(undefined8 *)(lVar11 + -8 + lVar7) = 0;
      }
    }
    lVar7 = lVar7 + 0x10;
  }
  if (lVar13 != lVar11) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar8) = lVar11;
  }
  lVar7 = 0;
  lVar11 = 0;
  while( true ) {
    lVar8 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode._vptr_TestNode + lVar9);
    lVar12 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx + lVar9);
    if ((int)((ulong)(lVar12 - lVar8) >> 3) <= lVar11) break;
    if (*(long *)(lVar8 + lVar7) != 0) {
      (*pLVar5->_vptr_Library[0x13])(pLVar5,(this->super_MultiThreadedTest).m_display);
      dVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
      eglu::checkError(dVar4,"destroyContext(m_display, contexts[contextNdx])",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x5d6);
      std::operator<<((ostream *)this_00,"eglDestroyContext(");
      pTVar6 = ThreadLog::operator<<(this_00,t);
      std::operator<<((ostream *)pTVar6,", ");
      pTVar6 = ThreadLog::operator<<
                         (pTVar6,(void **)(*(long *)((long)&(this->super_MultiThreadedTest).
                                                            super_TestCase.super_TestCase.
                                                            super_TestNode._vptr_TestNode + lVar9) +
                                          lVar7));
      pEVar10 = (EndMessageToken *)0x17263e7;
      std::operator<<((ostream *)pTVar6,")");
      ThreadLog::operator<<(pTVar6,pEVar10);
      *(undefined8 *)
       (*(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                         super_TestNode._vptr_TestNode + lVar9) + lVar7) = 0;
    }
    lVar11 = lVar11 + 1;
    lVar7 = lVar7 + 8;
  }
  if (lVar12 != lVar8) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar9) = lVar8;
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::destroyObjects (TestThread& thread)
{
	const Library&										egl			= getLibrary();
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < (int)pbuffers.size(); pbufferNdx++)
	{
		if (pbuffers[pbufferNdx] != EGL_NO_SURFACE)
		{
			// Destroy EGLSurface
			EGLBoolean result;

			result = egl.destroySurface(m_display, pbuffers[pbufferNdx]);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglDestroySurface(" << m_display << ", " << pbuffers[pbufferNdx] << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglDestroySurface()");
			pbuffers[pbufferNdx] = EGL_NO_SURFACE;
		}
	}
	pbuffers.clear();

	for (int windowNdx = 0; windowNdx < (int)windows.size(); windowNdx++)
	{
		if (windows[windowNdx].second != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << windows[windowNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, windows[windowNdx].second));
			windows[windowNdx].second = EGL_NO_SURFACE;
		}

		if (windows[windowNdx].first)
		{
			delete windows[windowNdx].first;
			windows[windowNdx].first = NULL;
		}
	}
	windows.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)pixmaps.size(); pixmapNdx++)
	{
		if (pixmaps[pixmapNdx].first != EGL_NO_SURFACE)
		{
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroySurface(" << m_display << ", " << pixmaps[pixmapNdx].second << ")" << ThreadLog::EndMessage;
			EGLU_CHECK_CALL(egl, destroySurface(m_display, pixmaps[pixmapNdx].second));
			pixmaps[pixmapNdx].second = EGL_NO_SURFACE;
		}

		if (pixmaps[pixmapNdx].first)
		{
			delete pixmaps[pixmapNdx].first;
			pixmaps[pixmapNdx].first = NULL;
		}
	}
	pixmaps.clear();

	for (int contextNdx = 0; contextNdx < (int)contexts.size(); contextNdx++)
	{
		if (contexts[contextNdx] != EGL_NO_CONTEXT)
		{
			EGLU_CHECK_CALL(egl, destroyContext(m_display, contexts[contextNdx]));
			thread.getLog() << ThreadLog::BeginMessage << "eglDestroyContext(" << m_display << ", " << contexts[contextNdx]  << ")" << ThreadLog::EndMessage;
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}
	}
	contexts.clear();
}